

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

bool __thiscall cmTarget::NeedRelinkBeforeInstall(cmTarget *this,string *config)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  string ll;
  string flagVar;
  allocator local_61;
  string local_60;
  string local_40;
  
  if (MODULE_LIBRARY < this->TargetTypeValue) {
    return false;
  }
  if (this->TargetTypeValue == STATIC_LIBRARY) {
    return false;
  }
  if (this->HaveInstallRule != true) {
    return false;
  }
  this_00 = this->Makefile;
  std::__cxx11::string::string((string *)&local_60,"CMAKE_SKIP_RPATH",(allocator *)&local_40);
  bVar1 = cmMakefile::IsOn(this_00,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (bVar1) {
    return false;
  }
  std::__cxx11::string::string
            ((string *)&local_60,"BUILD_WITH_INSTALL_RPATH",(allocator *)&local_40);
  bVar1 = GetPropertyAsBool(this,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (bVar1) {
    return false;
  }
  bVar1 = IsChrpathUsed(this,config);
  if (bVar1) {
    return false;
  }
  GetLinkerLanguage(&local_60,this,config);
  if (local_60._M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_40,"CMAKE_SHARED_LIBRARY_RUNTIME_",&local_61);
    std::__cxx11::string::append((string *)&local_40);
    std::__cxx11::string::append((char *)&local_40);
    bVar1 = cmMakefile::IsSet(this->Makefile,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if (bVar1) {
      bVar1 = HaveBuildTreeRPATH(this,config);
      bVar2 = true;
      if (!bVar1) {
        bVar2 = HaveInstallTreeRPATH(this);
      }
      goto LAB_0038ac1a;
    }
  }
  bVar2 = false;
LAB_0038ac1a:
  std::__cxx11::string::~string((string *)&local_60);
  return bVar2;
}

Assistant:

bool cmTarget::NeedRelinkBeforeInstall(const std::string& config) const
{
  // Only executables and shared libraries can have an rpath and may
  // need relinking.
  if(this->TargetTypeValue != cmTarget::EXECUTABLE &&
     this->TargetTypeValue != cmTarget::SHARED_LIBRARY &&
     this->TargetTypeValue != cmTarget::MODULE_LIBRARY)
    {
    return false;
    }

  // If there is no install location this target will not be installed
  // and therefore does not need relinking.
  if(!this->GetHaveInstallRule())
    {
    return false;
    }

  // If skipping all rpaths completely then no relinking is needed.
  if(this->Makefile->IsOn("CMAKE_SKIP_RPATH"))
    {
    return false;
    }

  // If building with the install-tree rpath no relinking is needed.
  if(this->GetPropertyAsBool("BUILD_WITH_INSTALL_RPATH"))
    {
    return false;
    }

  // If chrpath is going to be used no relinking is needed.
  if(this->IsChrpathUsed(config))
    {
    return false;
    }

  // Check for rpath support on this platform.
  std::string ll = this->GetLinkerLanguage(config);
  if(!ll.empty())
    {
    std::string flagVar = "CMAKE_SHARED_LIBRARY_RUNTIME_";
    flagVar += ll;
    flagVar += "_FLAG";
    if(!this->Makefile->IsSet(flagVar))
      {
      // There is no rpath support on this platform so nothing needs
      // relinking.
      return false;
      }
    }
  else
    {
    // No linker language is known.  This error will be reported by
    // other code.
    return false;
    }

  // If either a build or install tree rpath is set then the rpath
  // will likely change between the build tree and install tree and
  // this target must be relinked.
  return this->HaveBuildTreeRPATH(config) || this->HaveInstallTreeRPATH();
}